

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,size_t start_K,multi_ex *ec_seq)

{
  float fVar1;
  uint64_t uVar2;
  label_t lVar3;
  reference ppeVar4;
  wclass *pwVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  ulong in_RDX;
  label_feature_map *in_RDI;
  uint64_t old_offset;
  float old_weight;
  label_data simple_label;
  v_array<COST_SENSITIVE::wclass> costs;
  label save_cs_label;
  example *ec;
  size_t k_1;
  float ec_cost;
  size_t k;
  float max_cost;
  float min_cost;
  size_t K;
  label_feature_map *lab;
  value_type ec_00;
  label_feature_map *in_stack_ffffffffffffff40;
  float local_9c;
  float fStack_98;
  v_array<COST_SENSITIVE::wclass> local_90;
  label_t local_70;
  wclass *local_68;
  wclass *local_60;
  size_t local_58;
  value_type local_50;
  ulong local_48;
  float local_3c;
  ulong local_38;
  float local_30;
  float local_2c;
  ulong local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  ulong local_18;
  label_feature_map *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_28 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RCX);
  local_2c = 3.4028235e+38;
  local_30 = -3.4028235e+38;
  for (local_38 = local_18; local_38 < local_28; local_38 = local_38 + 1) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_38);
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar4)->l).simple,0);
    local_3c = pwVar5->x;
    if (local_3c < local_2c) {
      local_2c = local_3c;
    }
    if (local_30 < local_3c) {
      local_30 = local_3c;
    }
  }
  for (local_48 = local_18; local_48 < local_28; local_48 = local_48 + 1) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_48);
    local_50 = *ppeVar4;
    local_90._begin = *(wclass **)&(local_50->l).multi;
    local_90._end = (local_50->l).cs.costs._end;
    local_90.end_array = (local_50->l).cs.costs.end_array;
    local_90.erase_count = (local_50->l).cs.costs.erase_count;
    fVar1 = local_50->weight;
    local_70 = (label_t)local_90._begin;
    local_68 = local_90._end;
    local_60 = local_90.end_array;
    local_58 = local_90.erase_count;
    if (((ulong)local_8[1].equivalent_no_data & 0x10000) == 0) {
      pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
      local_9c = pwVar5->x;
    }
    else {
      pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
      if (local_2c < pwVar5->x) {
        local_9c = 1.0;
        pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
        local_50->weight = fVar1 * (pwVar5->x - local_2c);
      }
      else {
        local_9c = -1.0;
        local_50->weight = fVar1 * (local_30 - local_2c);
      }
    }
    lVar3.weight = fStack_98;
    lVar3.label = (uint32_t)local_9c;
    (local_50->l).multi = lVar3;
    (local_50->l).simple.initial = 0.0;
    lab = local_8;
    ec_00 = local_50;
    v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
    LabelDict::add_example_namespace_from_memory(in_stack_ffffffffffffff40,ec_00,(size_t)lab);
    uVar2 = (local_50->super_example_predict).ft_offset;
    (local_50->super_example_predict).ft_offset =
         (uint64_t)local_8[1].default_value.indicies.end_array;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_stack_ffffffffffffff40,ec_00,(size_t)lab);
    (local_50->super_example_predict).ft_offset = uVar2;
    in_stack_ffffffffffffff40 = local_8;
    v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
    LabelDict::del_example_namespace_from_memory(in_stack_ffffffffffffff40,ec_00,(size_t)lab);
    local_50->weight = fVar1;
    (local_50->l).multi = local_70;
    (local_50->l).cs.costs._end = local_68;
    (local_50->l).cs.costs.end_array = local_60;
    (local_50->l).cs.costs.erase_count = local_58;
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_90,0);
    local_50->partial_prediction = pwVar5->partial_prediction;
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, size_t start_K, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (size_t k = start_K; k < K; k++)
  {
    float ec_cost = ec_seq[k]->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (size_t k = start_K; k < K; k++)
  {
    example* ec = ec_seq[k];

    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}